

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

result_type
time_plain<std::shuffle_order_engine<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>,256ul>>
          (shuffle_order_engine<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_256UL>
           *r)

{
  result_type rVar1;
  ulong uVar2;
  time_t *in_RSI;
  string res;
  long i;
  long max;
  timer T;
  result_type s;
  double *in_stack_00000128;
  timer *in_stack_ffffffffffffff90;
  shuffle_order_engine<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_256UL>
  *in_stack_ffffffffffffffb0;
  long local_30;
  timer local_20;
  result_type local_10;
  
  local_10 = 0;
  timer::timer(in_stack_ffffffffffffff90);
  for (local_30 = 0; local_30 < 0x1000000; local_30 = local_30 + 1) {
    rVar1 = std::
            shuffle_order_engine<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_256UL>
            ::operator()(in_stack_ffffffffffffffb0);
    local_10 = rVar1 + local_10;
  }
  timer::time(&local_20,in_RSI);
  to_string<double>(in_stack_00000128);
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (9 < uVar2) break;
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb0,' ');
  }
  std::operator<<((ostream *)&std::cout,(string *)&stack0xffffffffffffffb0);
  rVar1 = local_10;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return rVar1;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}